

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_async_ref(void)

{
  uint uVar1;
  int iVar2;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  ulong uVar5;
  undefined8 in_R9;
  uv_async_t h;
  uv_timer_t uStack_370;
  uv_loop_t *puStack_2d8;
  uv_timer_t uStack_2c8;
  uv_loop_t *puStack_230;
  code *pcStack_228;
  uv_prepare_t uStack_218;
  uv_loop_t *puStack_1a0;
  uv_check_t uStack_190;
  uv_loop_t *puStack_118;
  uv_prepare_t uStack_108;
  uv_loop_t *puStack_90;
  uv_async_t uStack_88;
  
  puStack_90 = (uv_loop_t *)0x16679e;
  puVar3 = uv_default_loop();
  puStack_90 = (uv_loop_t *)0x1667ae;
  uv_async_init(puVar3,&uStack_88,(uv_async_cb)0x0);
  puStack_90 = (uv_loop_t *)0x1667b6;
  uv_unref((uv_handle_t *)&uStack_88);
  puStack_90 = (uv_loop_t *)0x1667bb;
  puVar3 = uv_default_loop();
  puStack_90 = (uv_loop_t *)0x1667c5;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_90 = (uv_loop_t *)0x1667cd;
  do_close(&uStack_88);
  puStack_90 = (uv_loop_t *)0x1667d2;
  puVar3 = uv_default_loop();
  puStack_90 = (uv_loop_t *)0x1667e6;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_90 = (uv_loop_t *)0x1667f0;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_90 = (uv_loop_t *)0x1667f5;
  puVar4 = uv_default_loop();
  puStack_90 = (uv_loop_t *)0x1667fd;
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    return 0;
  }
  puStack_90 = (uv_loop_t *)run_test_prepare_ref;
  run_test_async_ref_cold_1();
  puStack_118 = (uv_loop_t *)0x16681e;
  puStack_90 = puVar3;
  puVar3 = uv_default_loop();
  puStack_118 = (uv_loop_t *)0x16682e;
  uv_prepare_init(puVar3,&uStack_108);
  puStack_118 = (uv_loop_t *)0x16683d;
  uv_prepare_start(&uStack_108,fail_cb2);
  puStack_118 = (uv_loop_t *)0x166845;
  uv_unref((uv_handle_t *)&uStack_108);
  puStack_118 = (uv_loop_t *)0x16684a;
  puVar3 = uv_default_loop();
  puStack_118 = (uv_loop_t *)0x166854;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_118 = (uv_loop_t *)0x16685c;
  do_close(&uStack_108);
  puStack_118 = (uv_loop_t *)0x166861;
  puVar3 = uv_default_loop();
  puStack_118 = (uv_loop_t *)0x166875;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_118 = (uv_loop_t *)0x16687f;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_118 = (uv_loop_t *)0x166884;
  puVar4 = uv_default_loop();
  puStack_118 = (uv_loop_t *)0x16688c;
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    return 0;
  }
  puStack_118 = (uv_loop_t *)run_test_check_ref;
  run_test_prepare_ref_cold_1();
  puStack_1a0 = (uv_loop_t *)0x1668ad;
  puStack_118 = puVar3;
  puVar3 = uv_default_loop();
  puStack_1a0 = (uv_loop_t *)0x1668bd;
  uv_check_init(puVar3,&uStack_190);
  puStack_1a0 = (uv_loop_t *)0x1668cc;
  uv_check_start(&uStack_190,fail_cb2);
  puStack_1a0 = (uv_loop_t *)0x1668d4;
  uv_unref((uv_handle_t *)&uStack_190);
  puStack_1a0 = (uv_loop_t *)0x1668d9;
  puVar3 = uv_default_loop();
  puStack_1a0 = (uv_loop_t *)0x1668e3;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_1a0 = (uv_loop_t *)0x1668eb;
  do_close(&uStack_190);
  puStack_1a0 = (uv_loop_t *)0x1668f0;
  puVar3 = uv_default_loop();
  puStack_1a0 = (uv_loop_t *)0x166904;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_1a0 = (uv_loop_t *)0x16690e;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_1a0 = (uv_loop_t *)0x166913;
  puVar4 = uv_default_loop();
  puStack_1a0 = (uv_loop_t *)0x16691b;
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    return 0;
  }
  puStack_1a0 = (uv_loop_t *)run_test_unref_in_prepare_cb;
  run_test_check_ref_cold_1();
  pcStack_228 = (code *)0x16693c;
  puStack_1a0 = puVar3;
  puVar3 = uv_default_loop();
  pcStack_228 = (code *)0x16694c;
  uv_prepare_init(puVar3,&uStack_218);
  pcStack_228 = (code *)0x16695b;
  uv_prepare_start(&uStack_218,prepare_cb);
  pcStack_228 = (code *)0x166960;
  puVar3 = uv_default_loop();
  pcStack_228 = (code *)0x16696a;
  uv_run(puVar3,UV_RUN_DEFAULT);
  pcStack_228 = (code *)0x166972;
  do_close(&uStack_218);
  pcStack_228 = (code *)0x166977;
  puVar3 = uv_default_loop();
  pcStack_228 = (code *)0x16698b;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  pcStack_228 = (code *)0x166995;
  uv_run(puVar3,UV_RUN_DEFAULT);
  pcStack_228 = (code *)0x16699a;
  puVar4 = uv_default_loop();
  pcStack_228 = (code *)0x1669a2;
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    return 0;
  }
  pcStack_228 = prepare_cb;
  run_test_unref_in_prepare_cb_cold_1();
  if (puVar4 != (uv_loop_t *)0x0) {
    uVar1 = *(uint *)puVar4->watcher_queue;
    uVar5 = (ulong)uVar1;
    if ((uVar1 & 8) != 0) {
      *(uint *)puVar4->watcher_queue = uVar1 & 0xfffffff7;
      uVar5 = (ulong)(uVar1 & 5);
      if ((uVar1 & 5) == 4) {
        uVar5 = *(ulong *)&puVar4->active_handles;
        *(int *)(uVar5 + 8) = *(int *)(uVar5 + 8) + -1;
      }
    }
    return (int)uVar5;
  }
  puStack_230 = (uv_loop_t *)run_test_timer_ref;
  prepare_cb_cold_1();
  puStack_2d8 = (uv_loop_t *)0x1669d2;
  puStack_230 = puVar3;
  puVar3 = uv_default_loop();
  puStack_2d8 = (uv_loop_t *)0x1669e2;
  uv_timer_init(puVar3,&uStack_2c8);
  puStack_2d8 = (uv_loop_t *)0x1669ea;
  uv_unref((uv_handle_t *)&uStack_2c8);
  puStack_2d8 = (uv_loop_t *)0x1669ef;
  puVar3 = uv_default_loop();
  puStack_2d8 = (uv_loop_t *)0x1669f9;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_2d8 = (uv_loop_t *)0x166a01;
  do_close(&uStack_2c8);
  puStack_2d8 = (uv_loop_t *)0x166a06;
  puVar3 = uv_default_loop();
  puStack_2d8 = (uv_loop_t *)0x166a1a;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_2d8 = (uv_loop_t *)0x166a24;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_2d8 = (uv_loop_t *)0x166a29;
  puVar4 = uv_default_loop();
  puStack_2d8 = (uv_loop_t *)0x166a31;
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    return 0;
  }
  puStack_2d8 = (uv_loop_t *)run_test_timer_ref2;
  run_test_timer_ref_cold_1();
  puStack_2d8 = puVar3;
  puVar3 = uv_default_loop();
  uv_timer_init(puVar3,&uStack_370);
  uv_timer_start(&uStack_370,fail_cb,0x2a,0x2a);
  uv_unref((uv_handle_t *)&uStack_370);
  puVar3 = uv_default_loop();
  uv_run(puVar3,UV_RUN_DEFAULT);
  do_close(&uStack_370);
  puVar3 = uv_default_loop();
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  uv_run(puVar3,UV_RUN_DEFAULT);
  puVar4 = uv_default_loop();
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_timer_ref2_cold_1();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
          ,0x39,"fail_cb should not have been called",in_R9,puVar3);
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(async_ref) {
  uv_async_t h;
  uv_async_init(uv_default_loop(), &h, NULL);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}